

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.h
# Opt level: O0

long * __thiscall mocker::Token::val<long>(Token *this)

{
  bool bVar1;
  element_type *peVar2;
  undefined1 local_20 [8];
  shared_ptr<mocker::Token::Val<long>_> ptr;
  Token *this_local;
  
  ptr.super___shared_ptr<mocker::Token::Val<long>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  detail::checkTokenType<long>();
  std::dynamic_pointer_cast<mocker::Token::Val<long>,mocker::Token::ValBase>
            ((shared_ptr<mocker::Token::ValBase> *)local_20);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_20);
  if (!bVar1) {
    __assert_fail("ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/parse/token.h"
                  ,0x7c,"const T &mocker::Token::val() const [T = long]");
  }
  peVar2 = std::
           __shared_ptr_access<mocker::Token::Val<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::Token::Val<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::shared_ptr<mocker::Token::Val<long>_>::~shared_ptr
            ((shared_ptr<mocker::Token::Val<long>_> *)local_20);
  return &peVar2->val;
}

Assistant:

const T &val() const {
    detail::checkTokenType<T>();
    auto ptr = std::dynamic_pointer_cast<Val<T>>(valPtr);
    assert(ptr);
    return ptr->val;
  }